

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void helics::Federate::setTranslatorOperator
               (Translator *trans,shared_ptr<helics::TranslatorOperator> *transOps)

{
  shared_ptr<helics::TranslatorOperator> *in_RDI;
  shared_ptr<helics::TranslatorOperator> *in_stack_00000028;
  Translator *in_stack_00000030;
  shared_ptr<helics::TranslatorOperator> *in_stack_ffffffffffffffb8;
  
  std::shared_ptr<helics::TranslatorOperator>::shared_ptr(in_RDI,in_stack_ffffffffffffffb8);
  Translator::setOperator(in_stack_00000030,in_stack_00000028);
  std::shared_ptr<helics::TranslatorOperator>::~shared_ptr
            ((shared_ptr<helics::TranslatorOperator> *)0x21a282);
  return;
}

Assistant:

void Federate::setTranslatorOperator(Translator& trans,
                                     std::shared_ptr<TranslatorOperator> transOps)
{
    trans.setOperator(std::move(transOps));
}